

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Uint wabt::anon_unknown_0::FloatParser<float>::ShiftAndRoundToNearest
               (Uint significand,int shift,bool seen_trailing_non_zero)

{
  byte bVar1;
  Uint UStack_c;
  bool seen_trailing_non_zero_local;
  int shift_local;
  Uint significand_local;
  
  if (0 < shift) {
    bVar1 = (byte)shift;
    if (((significand & 1 << (bVar1 & 0x1f)) != 0) ||
       (UStack_c = significand, seen_trailing_non_zero)) {
      UStack_c = (1 << (bVar1 - 1 & 0x1f)) + significand;
    }
    return UStack_c >> (bVar1 & 0x1f);
  }
  __assert_fail("shift > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/literal.cc"
                ,0xc4,
                "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<float>::ShiftAndRoundToNearest(Uint, int, bool) [T = float]"
               );
}

Assistant:

typename FloatParser<T>::Uint FloatParser<T>::ShiftAndRoundToNearest(
    Uint significand,
    int shift,
    bool seen_trailing_non_zero) {
  assert(shift > 0);
  // Round ties to even.
  if ((significand & (Uint(1) << shift)) || seen_trailing_non_zero) {
    significand += Uint(1) << (shift - 1);
  }
  significand >>= shift;
  return significand;
}